

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CGL::Misc::init_mesh(void)

{
  double __x;
  uint uVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint i01;
  uint i11;
  uint i10;
  uint i00;
  uint *iptr;
  int j_1;
  int i_1;
  double sinlat;
  double *vptr;
  double lon;
  double lat;
  int j;
  int i;
  int local_30;
  int local_2c;
  int local_8;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x51; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 0x65; local_8 = local_8 + 1) {
      lVar3 = (long)((local_4 * 0x65 + local_8) * 8);
      Vertices[lVar3] = (double)local_8 / 100.0;
      Vertices[lVar3 + 1] = 1.0 - (double)local_4 / 80.0;
      dVar6 = ((double)local_4 / 80.0) * 3.141592653589793;
      __x = ((double)local_8 / 100.0) * 6.283185307179586;
      dVar4 = sin(dVar6);
      dVar5 = sin(__x);
      Vertices[lVar3 + 5] = dVar4 * dVar5;
      Vertices[lVar3 + 2] = dVar4 * dVar5;
      dVar6 = cos(dVar6);
      Vertices[lVar3 + 6] = dVar6;
      Vertices[lVar3 + 3] = dVar6;
      dVar6 = cos(__x);
      Vertices[lVar3 + 7] = dVar4 * dVar6;
      Vertices[lVar3 + 4] = dVar4 * dVar6;
    }
  }
  for (local_2c = 0; local_2c < 0x50; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 100; local_30 = local_30 + 1) {
      lVar3 = (long)((local_2c * 100 + local_30) * 6);
      uVar1 = local_2c * 0x65 + local_30;
      uVar2 = (local_2c + 1) * 0x65 + local_30 + 1;
      Indices[lVar3] = uVar1;
      Indices[lVar3 + 1] = (local_2c + 1) * 0x65 + local_30;
      Indices[lVar3 + 2] = uVar2;
      Indices[lVar3 + 3] = uVar2;
      Indices[lVar3 + 4] = local_2c * 0x65 + local_30 + 1;
      Indices[lVar3 + 5] = uVar1;
    }
  }
  return;
}

Assistant:

void init_mesh() {
  for ( int i = 0; i <= SPHERE_NUM_LAT; i++ ) {
    for ( int j = 0; j <= SPHERE_NUM_LON; j++ ) {
      double lat = ((double)i) / SPHERE_NUM_LAT;
      double lon = ((double)j) / SPHERE_NUM_LON;
      double *vptr = &Vertices[VERTEX_SIZE * SINDEX(i,j)];

      vptr[TCOORD_OFFSET + 0] = lon;
      vptr[TCOORD_OFFSET + 1] = 1-lat;

      lat *= PI;
      lon *= 2 * PI;
      double sinlat = sin( lat );

      vptr[NORMAL_OFFSET + 0] = vptr[VERTEX_OFFSET + 0] = sinlat * sin(lon);
      vptr[NORMAL_OFFSET + 1] = vptr[VERTEX_OFFSET + 1] = cos(lat),
      vptr[NORMAL_OFFSET + 2] = vptr[VERTEX_OFFSET + 2] = sinlat * cos(lon);
    }
  }

  for ( int i = 0; i < SPHERE_NUM_LAT; i++ ) {
    for ( int j = 0; j < SPHERE_NUM_LON; j++ ) {
      unsigned int* iptr = &Indices[6 * ( SPHERE_NUM_LON * i + j )];

      unsigned int i00 = SINDEX(i,  j  );
      unsigned int i10 = SINDEX(i+1,j  );
      unsigned int i11 = SINDEX(i+1,j+1);
      unsigned int i01 = SINDEX(i,  j+1);

      iptr[0] = i00;
      iptr[1] = i10;
      iptr[2] = i11;
      iptr[3] = i11;
      iptr[4] = i01;
      iptr[5] = i00;
    }
  }
}